

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5LocaleFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *__src;
  uchar *__src_00;
  sqlite3_context *pCtx_00;
  undefined8 *z;
  undefined1 *__dest;
  sqlite3_context *in_RDI;
  int nBlob;
  u8 *pCsr;
  u8 *pBlob;
  Fts5Global *p;
  int nText;
  char *zText;
  int nLocale;
  char *zLocale;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 *__dest_00;
  char *in_stack_ffffffffffffffb8;
  sqlite3_context *in_stack_ffffffffffffffc0;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  __src = sqlite3_value_text((sqlite3_value *)0x2657a5);
  iVar1 = sqlite3_value_bytes((sqlite3_value *)0x2657b7);
  __src_00 = sqlite3_value_text((sqlite3_value *)0x2657c9);
  iVar2 = sqlite3_value_bytes((sqlite3_value *)0x2657dc);
  if ((__src == (uchar *)0x0) || (*__src == '\0')) {
    sqlite3_result_text(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,iVar3,
                        (_func_void_void_ptr *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    pCtx_00 = (sqlite3_context *)sqlite3_user_data(in_RDI);
    iVar3 = iVar1 + 0x11 + iVar2;
    z = (undefined8 *)sqlite3_malloc(iVar3);
    if (z == (undefined8 *)0x0) {
      sqlite3_result_error_nomem((sqlite3_context *)0x26586f);
    }
    else {
      *z = *(undefined8 *)&pCtx_00[1].enc;
      z[1] = pCtx_00[1].argv[0];
      __dest_00 = z + 2;
      memcpy(__dest_00,__src,(long)iVar1);
      __dest = (undefined1 *)((long)__dest_00 + (long)iVar1) + 1;
      *(undefined1 *)((long)__dest_00 + (long)iVar1) = 0;
      if (__src_00 != (uchar *)0x0) {
        memcpy(__dest,__src_00,(long)iVar2);
      }
      sqlite3_result_blob(pCtx_00,z,(int)((ulong)__dest >> 0x20),
                          (_func_void_void_ptr *)CONCAT44(iVar3,in_stack_ffffffffffffffa8));
    }
  }
  return;
}

Assistant:

static void fts5LocaleFunc(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apArg           /* Function arguments */
){
  const char *zLocale = 0;
  int nLocale = 0;
  const char *zText = 0;
  int nText = 0;

  assert( nArg==2 );
  UNUSED_PARAM(nArg);

  zLocale = (const char*)sqlite3_value_text(apArg[0]);
  nLocale = sqlite3_value_bytes(apArg[0]);

  zText = (const char*)sqlite3_value_text(apArg[1]);
  nText = sqlite3_value_bytes(apArg[1]);

  if( zLocale==0 || zLocale[0]=='\0' ){
    sqlite3_result_text(pCtx, zText, nText, SQLITE_TRANSIENT);
  }else{
    Fts5Global *p = (Fts5Global*)sqlite3_user_data(pCtx);
    u8 *pBlob = 0;
    u8 *pCsr = 0;
    int nBlob = 0;

    nBlob = FTS5_LOCALE_HDR_SIZE + nLocale + 1 + nText;
    pBlob = (u8*)sqlite3_malloc(nBlob);
    if( pBlob==0 ){
      sqlite3_result_error_nomem(pCtx);
      return;
    }

    pCsr = pBlob;
    memcpy(pCsr, (const u8*)p->aLocaleHdr, FTS5_LOCALE_HDR_SIZE);
    pCsr += FTS5_LOCALE_HDR_SIZE;
    memcpy(pCsr, zLocale, nLocale);
    pCsr += nLocale;
    (*pCsr++) = 0x00;
    if( zText ) memcpy(pCsr, zText, nText);
    assert( &pCsr[nText]==&pBlob[nBlob] );

    sqlite3_result_blob(pCtx, pBlob, nBlob, sqlite3_free);
  }
}